

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O2

void __thiscall spvtools::opt::analysis::LivenessManager::ComputeLiveness(LivenessManager *this)

{
  _Head_base<0UL,_spvtools::opt::Module_*,_false> _Var1;
  Instruction *this_00;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  DefUseManager *this_01;
  Instruction *pIVar5;
  Instruction **ppIVar6;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  InitializeAnalysis(this);
  this_01 = IRContext::get_def_use_mgr(this->ctx_);
  _Var1._M_head_impl =
       (this->ctx_->module_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>.
       _M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
       super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar6 = (Instruction **)((long)&(_Var1._M_head_impl)->types_values_ + 0x10);
  do {
    this_00 = *ppIVar6;
    if (this_00 == (Instruction *)((long)&(_Var1._M_head_impl)->types_values_ + 8U)) {
      return;
    }
    if (this_00->opcode_ == OpVariable) {
      uVar3 = Instruction::type_id(this_00);
      pIVar5 = DefUseManager::GetDef(this_01,uVar3);
      if (pIVar5->opcode_ != OpTypePointer) {
        __assert_fail("var_type_inst->opcode() == spv::Op::OpTypePointer && \"Expected a pointer type\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/liveness.cpp"
                      ,0x12f,"void spvtools::opt::analysis::LivenessManager::ComputeLiveness()");
      }
      uVar3 = Instruction::GetSingleWordInOperand(pIVar5,0);
      if (uVar3 == 1) {
        uVar3 = Instruction::result_id(this_00);
        bVar2 = AnalyzeBuiltIn(this,uVar3);
        if (!bVar2) {
          uVar4 = Instruction::GetSingleWordInOperand(pIVar5,1);
          pIVar5 = DefUseManager::GetDef(this_01,uVar4);
          if (pIVar5->opcode_ == OpTypeArray) {
            uVar4 = Instruction::GetSingleWordInOperand(pIVar5,0);
            pIVar5 = DefUseManager::GetDef(this_01,uVar4);
            if (pIVar5->opcode_ == OpTypeStruct) {
              bVar2 = AnalyzeBuiltIn(this,uVar4);
              if (bVar2) goto LAB_002098df;
            }
          }
          local_38 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/liveness.cpp:329:38)>
                     ::_M_invoke;
          local_40 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/liveness.cpp:329:38)>
                     ::_M_manager;
          local_50._M_unused._M_object = this;
          local_50._8_8_ = this_00;
          DefUseManager::ForEachUser
                    (this_01,uVar3,(function<void_(spvtools::opt::Instruction_*)> *)&local_50);
          if (local_40 != (code *)0x0) {
            (*local_40)(&local_50,&local_50,__destroy_functor);
          }
        }
      }
    }
LAB_002098df:
    ppIVar6 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

void LivenessManager::ComputeLiveness() {
  InitializeAnalysis();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  // Process all input variables
  for (auto& var : context()->types_values()) {
    if (var.opcode() != spv::Op::OpVariable) {
      continue;
    }
    Instruction* var_type_inst = def_use_mgr->GetDef(var.type_id());
    assert(var_type_inst->opcode() == spv::Op::OpTypePointer &&
           "Expected a pointer type");
    const uint32_t kPointerTypeStorageClassInIdx = 0;
    spv::StorageClass sc = static_cast<spv::StorageClass>(
        var_type_inst->GetSingleWordInOperand(kPointerTypeStorageClassInIdx));
    if (sc != spv::StorageClass::Input) {
      continue;
    }
    // If var is builtin, mark live if analyzed and continue to next variable
    auto var_id = var.result_id();
    if (AnalyzeBuiltIn(var_id)) continue;
    // If interface block with builtin members, mark live if analyzed and
    // continue to next variable. Input interface blocks will only appear
    // in tesc, tese and geom shaders. Will need to strip off one level of
    // arrayness to get to block type.
    const uint32_t kPointerTypePointeeTypeInIdx = 1;
    uint32_t pte_type_id =
        var_type_inst->GetSingleWordInOperand(kPointerTypePointeeTypeInIdx);
    Instruction* pte_type_inst = def_use_mgr->GetDef(pte_type_id);
    if (pte_type_inst->opcode() == spv::Op::OpTypeArray) {
      uint32_t array_elt_type_id = pte_type_inst->GetSingleWordInOperand(0);
      Instruction* arr_elt_type = def_use_mgr->GetDef(array_elt_type_id);
      if (arr_elt_type->opcode() == spv::Op::OpTypeStruct) {
        if (AnalyzeBuiltIn(array_elt_type_id)) continue;
      }
    }
    // Mark all used locations of var live
    def_use_mgr->ForEachUser(var_id, [this, &var](Instruction* user) {
      auto op = user->opcode();
      if (op == spv::Op::OpEntryPoint || op == spv::Op::OpName ||
          op == spv::Op::OpDecorate || user->IsNonSemanticInstruction()) {
        return;
      }
      MarkRefLive(user, &var);
    });
  }
}